

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int saveCursorPosition(BtCursor *pCur)

{
  BtCursor *in_RDI;
  int rc;
  int local_4;
  
  if ((in_RDI->curFlags & 0x40) == 0) {
    if (in_RDI->eState == '\x02') {
      in_RDI->eState = '\0';
    }
    else {
      in_RDI->skipNext = 0;
    }
    local_4 = saveCursorKey(in_RDI);
    if (local_4 == 0) {
      btreeReleaseAllCursorPages(in_RDI);
      in_RDI->eState = '\x03';
    }
    in_RDI->curFlags = in_RDI->curFlags & 0xf1;
  }
  else {
    local_4 = 0xb13;
  }
  return local_4;
}

Assistant:

static int saveCursorPosition(BtCursor *pCur){
  int rc;

  assert( CURSOR_VALID==pCur->eState || CURSOR_SKIPNEXT==pCur->eState );
  assert( 0==pCur->pKey );
  assert( cursorHoldsMutex(pCur) );

  if( pCur->curFlags & BTCF_Pinned ){
    return SQLITE_CONSTRAINT_PINNED;
  }
  if( pCur->eState==CURSOR_SKIPNEXT ){
    pCur->eState = CURSOR_VALID;
  }else{
    pCur->skipNext = 0;
  }

  rc = saveCursorKey(pCur);
  if( rc==SQLITE_OK ){
    btreeReleaseAllCursorPages(pCur);
    pCur->eState = CURSOR_REQUIRESEEK;
  }

  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl|BTCF_AtLast);
  return rc;
}